

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O1

int secp256k1_ec_pubkey_cmp
              (secp256k1_context *ctx,secp256k1_pubkey *pubkey0,secp256k1_pubkey *pubkey1)

{
  int iVar1;
  size_t count;
  long lVar2;
  byte *output;
  size_t out_size;
  secp256k1_pubkey *pk [2];
  uchar out [2] [33];
  size_t local_80;
  secp256k1_pubkey *local_78 [2];
  byte local_68 [33];
  byte abStack_47 [39];
  
  if (ctx != (secp256k1_context *)0x0) {
    local_78[0] = pubkey0;
    local_78[1] = pubkey1;
    output = local_68;
    lVar2 = 0;
    do {
      local_80 = 0x21;
      iVar1 = secp256k1_ec_pubkey_serialize(ctx,output,&local_80,local_78[lVar2],0x102);
      if (iVar1 == 0) {
        output[0x10] = 0;
        output[0x11] = 0;
        output[0x12] = 0;
        output[0x13] = 0;
        output[0x14] = 0;
        output[0x15] = 0;
        output[0x16] = 0;
        output[0x17] = 0;
        output[0x18] = 0;
        output[0x19] = 0;
        output[0x1a] = 0;
        output[0x1b] = 0;
        output[0x1c] = 0;
        output[0x1d] = 0;
        output[0x1e] = 0;
        output[0x1f] = 0;
        output[0] = 0;
        output[1] = 0;
        output[2] = 0;
        output[3] = 0;
        output[4] = 0;
        output[5] = 0;
        output[6] = 0;
        output[7] = 0;
        output[8] = 0;
        output[9] = 0;
        output[10] = 0;
        output[0xb] = 0;
        output[0xc] = 0;
        output[0xd] = 0;
        output[0xe] = 0;
        output[0xf] = 0;
        output[0x20] = 0;
      }
      lVar2 = lVar2 + 1;
      output = output + 0x21;
    } while (lVar2 == 1);
    lVar2 = 0;
    do {
      if (local_68[lVar2] != abStack_47[lVar2]) {
        return (uint)local_68[lVar2] - (uint)abStack_47[lVar2];
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x21);
    return 0;
  }
  secp256k1_ec_pubkey_cmp_cold_1();
  if (ctx == (secp256k1_context *)0x0) {
    secp256k1_ec_pubkey_sort_cold_2();
  }
  else if (pubkey0 != (secp256k1_pubkey *)0x0) {
    secp256k1_hsort(pubkey0,count,8,secp256k1_ec_pubkey_sort_cmp,ctx);
    return 1;
  }
  secp256k1_ec_pubkey_sort_cold_1();
  return 0;
}

Assistant:

int secp256k1_ec_pubkey_cmp(const secp256k1_context* ctx, const secp256k1_pubkey* pubkey0, const secp256k1_pubkey* pubkey1) {
    unsigned char out[2][33];
    const secp256k1_pubkey* pk[2];
    int i;

    VERIFY_CHECK(ctx != NULL);
    pk[0] = pubkey0; pk[1] = pubkey1;
    for (i = 0; i < 2; i++) {
        size_t out_size = sizeof(out[i]);
        /* If the public key is NULL or invalid, ec_pubkey_serialize will call
         * the illegal_callback and return 0. In that case we will serialize the
         * key as all zeros which is less than any valid public key. This
         * results in consistent comparisons even if NULL or invalid pubkeys are
         * involved and prevents edge cases such as sorting algorithms that use
         * this function and do not terminate as a result. */
        if (!secp256k1_ec_pubkey_serialize(ctx, out[i], &out_size, pk[i], SECP256K1_EC_COMPRESSED)) {
            /* Note that ec_pubkey_serialize should already set the output to
             * zero in that case, but it's not guaranteed by the API, we can't
             * test it and writing a VERIFY_CHECK is more complex than
             * explicitly memsetting (again). */
            memset(out[i], 0, sizeof(out[i]));
        }
    }
    return secp256k1_memcmp_var(out[0], out[1], sizeof(out[0]));
}